

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
read_decimal_fraction
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          string_type *result,error_code *ec)

{
  byte *pbVar1;
  pointer puVar2;
  uint8_t *puVar3;
  byte bVar4;
  cbor_errc cVar5;
  size_t sVar6;
  uint64_t uVar7;
  uint64_t value;
  int64_t value_00;
  byte *pbVar8;
  size_type length;
  _Alloc_hider buffer;
  byte bVar9;
  string_type str;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  sVar6 = get_size(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (sVar6 != 2) {
LAB_001e763e:
    cVar5 = invalid_decimal_fraction;
LAB_001e7644:
    std::error_code::operator=(ec,cVar5);
    this->more_ = false;
    return;
  }
  pbVar8 = (this->source_).current_;
  if ((this->source_).end_ <= pbVar8) {
    cVar5 = unexpected_eof;
    goto LAB_001e7644;
  }
  bVar9 = *pbVar8 >> 5;
  if (bVar9 == 0) {
    uVar7 = get_uint64_value(this,ec);
  }
  else {
    if (bVar9 != 1) goto LAB_001e763e;
    uVar7 = get_int64_value(this,ec);
  }
  if (ec->_M_value != 0) {
    return;
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  pbVar8 = (this->source_).current_;
  pbVar1 = (this->source_).end_;
  cVar5 = unexpected_eof;
  if (pbVar8 < pbVar1) {
    bVar9 = *pbVar8;
    bVar4 = bVar9 >> 5;
    if (bVar4 != 6) {
      if (bVar4 == 1) {
        value_00 = get_int64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_001e785e;
        jsoncons::detail::from_integer<long,std::__cxx11::string>(value_00,&str);
      }
      else {
        cVar5 = invalid_decimal_fraction;
        if (bVar4 != 0) goto LAB_001e784f;
        value = get_uint64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_001e785e;
        jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(value,&str);
      }
      goto LAB_001e781d;
    }
    pbVar8 = pbVar8 + 1;
    (this->source_).current_ = pbVar8;
    if (pbVar1 <= pbVar8) goto LAB_001e784f;
    if ((*pbVar8 & 0xe0) != 0x40) {
LAB_001e781d:
      cVar5 = invalid_decimal_fraction;
      if (0xffffffff80000001 < str._M_string_length - 0x7fffffff &&
          0xffffffff00000001 < uVar7 - 0x7fffffff) {
        length = str._M_string_length;
        buffer._M_p = str._M_dataplus._M_p;
        if (*str._M_dataplus._M_p == '-') {
          std::__cxx11::string::push_back((char)result);
          buffer._M_p = str._M_dataplus._M_p + 1;
          length = str._M_string_length - 1;
        }
        jsoncons::detail::prettify_string<std::__cxx11::string>
                  (buffer._M_p,length,(int)uVar7,-4,0x11,result);
        goto LAB_001e785e;
      }
      goto LAB_001e784f;
    }
    puVar2 = (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    read_byte_string(this,&this->bytes_buffer_,ec);
    if (ec->_M_value == 0) {
      bVar9 = bVar9 & 0x1f;
      if (bVar9 == 3) {
        puVar3 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&n,1,puVar3,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3);
        local_58.field_0._0_1_ = 2;
        local_58.field_0.common_stor_.length_ = 1;
        local_58.field_0.short_stor_.values_[0] = 1;
        local_58.field_0.short_stor_.values_[1] = 0;
        operator-(&local_80,&local_58,&n);
        basic_bigint<std::allocator<unsigned_char>_>::operator=(&n,&local_80);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_80);
        basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_58);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&n,&str);
      }
      else {
        if (bVar9 != 2) goto LAB_001e781d;
        puVar3 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&n,1,puVar3,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&n,&str);
      }
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
      goto LAB_001e781d;
    }
  }
  else {
LAB_001e784f:
    std::error_code::operator=(ec,cVar5);
  }
  this->more_ = false;
LAB_001e785e:
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void read_decimal_fraction(string_type& result, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        string_type str(alloc_);

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }

        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);
                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear();
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string(str);
                    }
                    else if (tag == 3)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string(str);
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        if (str.size() >= static_cast<std::size_t>((std::numeric_limits<int32_t>::max)()) || 
            exponent >= (std::numeric_limits<int32_t>::max)() || 
            exponent <= (std::numeric_limits<int32_t>::min)())
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
        else if (str.size() > 0)
        {
            if (str[0] == '-')
            {
                result.push_back('-');
                jsoncons::detail::prettify_string(str.c_str()+1, str.size()-1, (int)exponent, -4, 17, result);
            }
            else
            {
                jsoncons::detail::prettify_string(str.c_str(), str.size(), (int)exponent, -4, 17, result);
            }
        }
        else
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
    }